

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

bool absl::lts_20250127::numbers_internal::safe_strtou32_base
               (string_view text,Nonnull<uint32_t_*> value,int base)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *in_R9;
  byte *pbVar12;
  
  pbVar10 = (byte *)text._M_str;
  pbVar11 = (byte *)text._M_len;
  *value = 0;
  bVar4 = true;
  if (pbVar10 == (byte *)0x0) goto LAB_0033c5c5;
  pbVar6 = pbVar10;
  if (0 < (long)pbVar11) {
    do {
      if (((&ascii_internal::kPropertyBits)[*pbVar6] & 8) == 0) break;
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 < pbVar10 + (long)pbVar11);
  }
  pbVar12 = pbVar10 + 1;
  in_R9 = pbVar10;
  do {
    if (in_R9 + (long)pbVar11 <= pbVar6) goto LAB_0033c5c5;
    pbVar1 = in_R9 + -1;
    pbVar12 = pbVar12 + -1;
    in_R9 = in_R9 + -1;
  } while (((&ascii_internal::kPropertyBits)[pbVar1[(long)pbVar11]] & 8) != 0);
  bVar2 = *pbVar6;
  pbVar1 = in_R9 + (long)pbVar11;
  in_R9 = (byte *)(ulong)(bVar2 == 0x2d);
  if (((bVar2 == 0x2d) || (bVar2 == 0x2b)) && (pbVar6 = pbVar6 + 1, pbVar1 + 1 <= pbVar6))
  goto LAB_0033c5c5;
  if (base == 0x10) {
    uVar9 = 0x10;
    if (((1 < (long)(pbVar12 + ((long)pbVar11 - (long)pbVar6))) && (*pbVar6 == 0x30)) &&
       ((pbVar6[1] | 0x20) == 0x78)) {
LAB_0033c68b:
      pbVar6 = pbVar6 + 2;
      uVar9 = 0x10;
      if (pbVar1 + 1 <= pbVar6) goto LAB_0033c5c5;
    }
  }
  else if (base == 0) {
    if (((1 < (long)(pbVar12 + ((long)pbVar11 - (long)pbVar6))) && (*pbVar6 == 0x30)) &&
       ((pbVar6[1] | 0x20) == 0x78)) goto LAB_0033c68b;
    if ((long)(pbVar12 + ((long)pbVar11 - (long)pbVar6)) < 1) {
      uVar9 = 10;
    }
    else {
      bVar2 = *pbVar6;
      pbVar6 = pbVar6 + (bVar2 == 0x30);
      uVar9 = (uint)(bVar2 != 0x30) * 2 + 8;
    }
  }
  else {
    uVar9 = base;
    if (0x22 < base - 2U) goto LAB_0033c5c5;
  }
  base = uVar9;
  pbVar11 = pbVar12 + ((long)pbVar11 - (long)pbVar6);
  bVar4 = false;
  pbVar10 = pbVar6;
LAB_0033c5c5:
  if (((ulong)in_R9 & 1) == 0 && !bVar4) {
    if (base < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                    ,0x3db,
                    "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned int]"
                   );
    }
    uVar9 = *(uint *)(lts_20250127::(anonymous_namespace)::LookupTables<unsigned_int>::kVmaxOverBase
                     + (ulong)(uint)base * 4);
    if ((1 < base) && ((uint)(0xffffffff / (ulong)(uint)base) != uVar9)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                    ,0x3e0,
                    "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned int]"
                   );
    }
    bVar4 = (long)pbVar11 < 1;
    if ((long)pbVar11 < 1) {
      uVar8 = 0;
    }
    else {
      pbVar11 = pbVar11 + (long)pbVar10;
      uVar5 = 0;
      do {
        uVar7 = (uint)(char)lts_20250127::(anonymous_namespace)::kAsciiToInt[*pbVar10];
        if (uVar7 < (uint)base) {
          if (uVar9 < uVar5) {
LAB_0033c62e:
            *value = 0xffffffff;
            goto LAB_0033c63a;
          }
          uVar5 = uVar5 * base;
          uVar8 = uVar7 + uVar5;
          if (CARRY4(uVar7,uVar5)) goto LAB_0033c62e;
          bVar3 = true;
        }
        else {
          *value = uVar5;
LAB_0033c63a:
          bVar3 = false;
          uVar8 = uVar5;
        }
        if (!bVar3) {
          return bVar4;
        }
        pbVar10 = pbVar10 + 1;
        bVar4 = pbVar10 >= pbVar11;
        uVar5 = uVar8;
      } while (pbVar10 < pbVar11);
    }
    *value = uVar8;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool safe_strtou32_base(absl::string_view text, absl::Nonnull<uint32_t*> value,
                        int base) {
  return safe_uint_internal<uint32_t>(text, value, base);
}